

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O2

void anon_unknown.dwarf_4cac::
     Test_TemplateDictionary_TestShowTemplateGlobalSection_SectionDoesntExist::Run(void)

{
  string out;
  TemplateDictionary dict;
  undefined1 local_c8 [32];
  TemplateString local_a8;
  TemplateString local_88 [3];
  
  ctemplate::TemplateString::TemplateString(local_88,"test3.tpl");
  ctemplate::TemplateString::TemplateString((TemplateString *)local_c8,"{{#bad}}bad{{/bad}}");
  ctemplate::StringToTemplateCache(local_88,(TemplateString *)local_c8,DO_NOT_STRIP);
  ctemplate::TemplateString::TemplateString((TemplateString *)local_c8,"mydict");
  ctemplate::TemplateDictionary::TemplateDictionary
            ((TemplateDictionary *)local_88,(TemplateString *)local_c8,(UnsafeArena *)0x0);
  local_c8._0_8_ = local_c8 + 0x10;
  local_c8._8_8_ = 0;
  local_c8[0x10] = false;
  ctemplate::TemplateString::TemplateString(&local_a8,"test3.tpl");
  ctemplate::ExpandTemplate
            (&local_a8,DO_NOT_STRIP,(TemplateDictionaryInterface *)local_88,(string *)local_c8);
  std::__cxx11::string::~string((string *)local_c8);
  ctemplate::TemplateDictionary::~TemplateDictionary((TemplateDictionary *)local_88);
  return;
}

Assistant:

TEST(TemplateDictionary, TestShowTemplateGlobalSection_SectionDoesntExist) {
  StringToTemplateCache("test3.tpl",
                        "{{#bad}}bad{{/bad}}",
                        DO_NOT_STRIP);

  TemplateDictionary dict("mydict");

  string out;
  ExpandTemplate("test3.tpl", DO_NOT_STRIP, &dict, &out);
}